

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afg2mps.cpp
# Opt level: O3

ssize_t __thiscall MPS::write(MPS *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  void **ppvVar2;
  undefined4 extraout_var;
  runtime_error *this_00;
  uint uVar3;
  ulong uVar4;
  va_list v;
  char _error_msg_ [256];
  void **local_1e0;
  void *local_1c8 [3];
  size_t local_1b0;
  char local_118 [256];
  
  this->p = 0;
  this->cur_field = 0;
  builtin_strncpy(this->buf,
                  "                                                                                "
                  ,0x50);
  local_1e0 = &v[0].overflow_arg_area;
  uVar3 = 0x10;
  local_1c8[2] = __buf;
  local_1b0 = __n;
  if (0 < __fd) {
    do {
      uVar4 = (ulong)uVar3;
      if (uVar4 < 0x29) {
        uVar3 = uVar3 + 8;
        ppvVar2 = (void **)((long)local_1c8 + uVar4);
      }
      else {
        ppvVar2 = local_1e0;
        local_1e0 = local_1e0 + 1;
      }
      add_field(this,(char *)*ppvVar2);
      __fd = __fd + -1;
    } while (__fd != 0);
  }
  if ((long)this->p < 0x50) {
    this->buf[this->p] = '\0';
    iVar1 = fprintf((FILE *)this->fout,"%s\n",this->buf);
    this->p = 0;
    this->cur_field = 0;
    builtin_strncpy(this->buf,
                    "                                                                                "
                    ,0x50);
    return CONCAT44(extraout_var,iVar1);
  }
  snprintf(local_118,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d","p < BUF_LEN",
           "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/afg2mps.cpp"
           ,0x3b);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,local_118);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void write(int count, ...) {
		clear();

		va_list v;
		va_start(v, count);
		for (int i = 0; i < count; i++) {
			add_field(va_arg(v, const char *));
		}
		va_end(v);

		throw_assert(p < BUF_LEN);
		buf[p] = 0;
		fprintf(fout, "%s\n", buf);
		clear();
	}